

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
GetNode(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
        *this,FName *key)

{
  TValueTraits<FOptionalMapinfoDataPtr> local_31;
  FName local_30;
  TValueTraits<FOptionalMapinfoDataPtr> traits;
  Node *n;
  FName *key_local;
  TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
  *this_local;
  
  FName::FName((FName *)&stack0xffffffffffffffd4,key);
  this_local = (TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
                *)FindKey(this,(FName *)&stack0xffffffffffffffd4);
  if (this_local ==
      (TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
       *)0x0) {
    FName::FName(&local_30,key);
    this_local = (TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
                  *)NewKey(this,&local_30);
    TValueTraits<FOptionalMapinfoDataPtr>::Init
              (&local_31,(FOptionalMapinfoDataPtr *)&this_local->Size);
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}